

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::Interpreter
          (Interpreter *this,Allocator *alloc,ExtMap *ext_vars,uint max_stack,double gc_min_objects,
          double gc_growth_trigger,VmNativeCallbackMap *native_callbacks,
          JsonnetImportCallback *import_callback,void *import_callback_context)

{
  ExtMap *this_00;
  BuiltinMap *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long uVar2;
  byte bVar3;
  AST *pAVar4;
  Identifier *pIVar5;
  Var *pVVar6;
  mapped_type *pmVar7;
  DesugaredObject *ast;
  HeapEntity *pHVar8;
  _Base_ptr p_Var9;
  HeapObject *pHVar10;
  u32string *puVar11;
  mapped_type from;
  _Rb_tree_header *p_Var12;
  mapped_type *ppHVar13;
  long lVar14;
  ulong uVar15;
  pointer pFVar16;
  pointer pFVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  UString name;
  LocationRange local_f8;
  ExtMap *local_b8;
  _Base_ptr local_b0;
  Allocator *local_a8;
  _Base_ptr local_a0;
  string local_98;
  Stack *local_70;
  vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
  *local_68;
  pointer local_60;
  SourceFuncMap *local_58;
  string local_50;
  
  (this->heap).gcTuneMinObjects = (uint)(long)gc_min_objects;
  (this->heap).gcTuneGrowthTrigger = gc_growth_trigger;
  (this->heap).lastMark = '\0';
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heap).lastNumEntities = 0;
  (this->heap).numEntities = 0;
  local_70 = &this->stack;
  (this->stack)._vptr_Stack = (_func_int **)&PTR_dump_0029b5f8;
  (this->stack).calls = 0;
  (this->stack).limit = max_stack;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->alloc = alloc;
  paVar1 = &local_f8.file.field_2;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  local_b0 = (_Base_ptr)import_callback;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f8,L"import",L"");
  pIVar5 = Allocator::makeIdentifier(alloc,(UString *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idImport = pIVar5;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u32string::_M_construct<char32_t_const*>
            ((u32string *)&local_f8,L"array_element",L"");
  pIVar5 = Allocator::makeIdentifier(alloc,(UString *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idArrayElement = pIVar5;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u32string::_M_construct<char32_t_const*>
            ((u32string *)&local_f8,L"object_assert",L"");
  pIVar5 = Allocator::makeIdentifier(alloc,(UString *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idInvariant = pIVar5;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f8,L"__internal__",L"")
  ;
  pIVar5 = Allocator::makeIdentifier(alloc,(UString *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idInternal = pIVar5;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f8,L"_",L"");
  pIVar5 = Allocator::makeIdentifier(alloc,(UString *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idJsonObjVar = pIVar5;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f8,L"");
  local_a8 = alloc;
  pIVar5 = Allocator::makeIdentifier(alloc,(UString *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idEmpty = pIVar5;
  local_f8.file._M_string_length = 0;
  local_f8.file.field_2._M_local_buf[0] = '\0';
  local_f8.begin.line = 0;
  local_f8.begin.column = 0;
  local_f8.end.line = 0;
  local_f8.end.column = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  pVVar6 = Allocator::
           make<jsonnet::internal::Var,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,jsonnet::internal::Identifier_const*&>
                     (local_a8,&local_f8,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)&local_98,&this->idJsonObjVar);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  this->jsonObjVar = &pVVar6->super_AST;
  local_a0 = &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_a0;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_a0;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->externalVars;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  ::_Rb_tree(&this_00->_M_t,&ext_vars->_M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
  ::_Rb_tree(&(this->nativeCallbacks)._M_t,&native_callbacks->_M_t);
  this->importCallback = (JsonnetImportCallback *)local_b0;
  this->importCallbackContext = import_callback_context;
  p_Var12 = &(this->builtins)._M_t._M_impl.super__Rb_tree_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var12->_M_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var12->_M_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_b0;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_b0;
  local_68 = (vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
              *)&this->sourceFuncIds;
  (this->scratch).t = NULL_TYPE;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"makeArray","");
  this_01 = &this->builtins;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinMakeArray;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"pow","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinPow;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"floor","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinFloor;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ceil","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinCeil;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"sqrt","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinSqrt;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"sin","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinSin;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"cos","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinCos;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"tan","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinTan;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"asin","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinAsin;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"acos","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinAcos;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"atan","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinAtan;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"type","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinType;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"filter","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinFilter;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"objectHasEx","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinObjectHasEx;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"length","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinLength;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"objectFieldsEx","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinObjectFieldsEx;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"codepoint","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinCodepoint;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"char","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinChar;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"log","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinLog;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"exp","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinExp;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"mantissa","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinMantissa;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"exponent","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinExponent;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"modulo","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinModulo;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"extVar","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinExtVar;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"primitiveEquals","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinPrimitiveEquals;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"native","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinNative;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"md5","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinMd5;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"trace","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinTrace;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"splitLimit","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinSplitLimit;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"substr","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinSubstr;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"range","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinRange;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"strReplace","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinStrReplace;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"asciiLower","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinAsciiLower;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"asciiUpper","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinAsciiUpper;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"join","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinJoin;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"parseJson","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinParseJson;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"parseYaml","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinParseYaml;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"encodeUTF8","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinEncodeUTF8;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"decodeUTF8","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinDecodeUTF8;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"atan2","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinAtan2;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_f8.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"hypot","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f8.file);
  *pmVar7 = (mapped_type)builtinHypot;
  pmVar7[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"__internal__","");
  ast = makeStdlibAST(local_a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  jsonnet_static_analysis(&ast->super_AST);
  this->stdlibAST = ast;
  pHVar8 = (HeapEntity *)operator_new(0x70);
  local_a8 = (Allocator *)&(this->heap).entities;
  *(undefined2 *)&pHVar8->type = 0;
  pHVar8->_vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0029b638;
  pHVar8[2]._vptr_HeapEntity = (_func_int **)0x0;
  *(undefined4 *)&pHVar8[3]._vptr_HeapEntity = 0;
  pHVar8[3].mark = '\0';
  pHVar8[3].type = THUNK;
  *(undefined6 *)&pHVar8[3].field_0xa = 0;
  pHVar8[4]._vptr_HeapEntity = (_func_int **)(pHVar8 + 3);
  *(HeapEntity **)&pHVar8[4].mark = pHVar8 + 3;
  pHVar8[5]._vptr_HeapEntity = (_func_int **)0x0;
  pHVar8[5].mark = '\0';
  pHVar8[5].type = THUNK;
  *(undefined6 *)&pHVar8[5].field_0xa = 0;
  *(undefined4 *)&pHVar8[6]._vptr_HeapEntity = 0;
  *(DesugaredObject **)&pHVar8[6].mark = ast;
  local_f8.file._M_dataplus._M_p = (pointer)pHVar8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)local_a8,(value_type *)&local_f8);
  bVar3 = (this->heap).lastMark;
  pHVar8->mark = bVar3;
  lVar14 = (long)(this->heap).entities.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->heap).entities.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar15 = lVar14 >> 3;
  (this->heap).numEntities = uVar15;
  if (((this->heap).gcTuneMinObjects < uVar15) &&
     (auVar18._8_4_ = (int)(lVar14 >> 0x23), auVar18._0_8_ = uVar15, auVar18._12_4_ = 0x45300000,
     uVar2 = (this->heap).lastNumEntities, auVar19._8_4_ = (int)(uVar2 >> 0x20),
     auVar19._0_8_ = uVar2, auVar19._12_4_ = 0x45300000,
     ((auVar19._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
     (this->heap).gcTuneGrowthTrigger <
     (auVar18._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0))) {
    Heap::markFrom((Heap *)(ulong)bVar3,pHVar8);
    Stack::mark((Stack *)(this->stack).stack.
                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                (Heap *)(this->stack).stack.
                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (((this->scratch).t & ARRAY) != NULL_TYPE) {
      Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(this->scratch).v.h);
    }
    p_Var9 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var9 != local_a0) {
      do {
        if (*(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40) != (HeapEntity *)0x0) {
          Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                         *(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40));
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_a0);
    }
    p_Var9 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var9 != local_b0) {
      do {
        Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,*(HeapEntity **)(p_Var9 + 2));
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_b0);
    }
    Heap::sweep(&this->heap);
  }
  Stack::newCall(local_70,(LocationRange *)(*(long *)&pHVar8[6].mark + 8),pHVar8,
                 *(HeapObject **)&pHVar8[5].mark,*(uint *)&pHVar8[6]._vptr_HeapEntity,
                 (BindingFrame *)&pHVar8[2].mark);
  evaluate(this,*(AST **)&pHVar8[6].mark,0);
  pHVar8 = (this->scratch).v.h;
  local_b8 = this_00;
  if (pHVar8 == (HeapEntity *)0x0) {
    pHVar10 = (HeapObject *)0x0;
  }
  else {
    pHVar10 = (HeapObject *)
              __dynamic_cast(pHVar8,&(anonymous_namespace)::HeapEntity::typeinfo,
                             &(anonymous_namespace)::HeapObject::typeinfo,0);
  }
  this->stdObject = pHVar10;
  pFVar16 = (this->stdlibAST->fields).
            super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar17 = (this->stdlibAST->fields).
            super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar16 != pFVar17) {
    local_58 = &this->sourceVals;
    local_60 = pFVar17;
    do {
      if (pFVar16->name->type == AST_LITERAL_STRING) {
        lVar14 = __dynamic_cast(pFVar16->name,&AST::typeinfo,&LiteralString::typeinfo,0);
        local_f8.file._M_dataplus._M_p = (pointer)&local_f8.file.field_2;
        std::__cxx11::u32string::_M_construct<char32_t*>
                  ((u32string *)&local_f8,*(long *)(lVar14 + 0x80),
                   *(long *)(lVar14 + 0x80) + *(long *)(lVar14 + 0x88) * 4);
        puVar11 = (u32string *)operator_new(0x20);
        *(u32string **)puVar11 = puVar11 + 0x10;
        std::__cxx11::u32string::_M_construct<char32_t*>
                  (puVar11,local_f8.file._M_dataplus._M_p,
                   local_f8.file._M_dataplus._M_p + local_f8.file._M_string_length * 4);
        local_98._M_dataplus._M_p = (pointer)puVar11;
        std::
        vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
        ::emplace_back<jsonnet::internal::Identifier*>(local_68,(Identifier **)&local_98);
        pHVar10 = this->stdObject;
        pIVar5 = (this->sourceFuncIds).
                 super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Identifier_*,_std::default_delete<jsonnet::internal::Identifier>_>
                 .super__Head_base<0UL,_jsonnet::internal::Identifier_*,_false>._M_head_impl;
        pAVar4 = pFVar16->body;
        from = (mapped_type)operator_new(0x70);
        *(undefined2 *)&(from->super_HeapEntity).type = 0;
        (from->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0029b638;
        from->name = pIVar5;
        p_Var12 = &(from->upValues)._M_t._M_impl.super__Rb_tree_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var12->_M_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var12->_M_header
        ;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        from->self = pHVar10;
        from->offset = 0;
        from->body = pAVar4;
        local_98._M_dataplus._M_p = (pointer)from;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     *)local_a8,(value_type *)&local_98);
        bVar3 = (this->heap).lastMark;
        (from->super_HeapEntity).mark = bVar3;
        lVar14 = (long)(this->heap).entities.
                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->heap).entities.
                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = lVar14 >> 3;
        (this->heap).numEntities = uVar15;
        if (((this->heap).gcTuneMinObjects < uVar15) &&
           (auVar20._8_4_ = (int)(lVar14 >> 0x23), auVar20._0_8_ = uVar15,
           auVar20._12_4_ = 0x45300000, uVar2 = (this->heap).lastNumEntities,
           auVar21._8_4_ = (int)(uVar2 >> 0x20), auVar21._0_8_ = uVar2, auVar21._12_4_ = 0x45300000,
           ((auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
           (this->heap).gcTuneGrowthTrigger <
           (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0))) {
          Heap::markFrom((Heap *)(ulong)bVar3,(HeapEntity *)from);
          Stack::mark((Stack *)(this->stack).stack.
                               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                      (Heap *)(this->stack).stack.
                              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          if (((this->scratch).t & ARRAY) != NULL_TYPE) {
            Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,(this->scratch).v.h);
          }
          p_Var9 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var9 != local_a0) {
            do {
              if (*(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40) != (HeapEntity *)0x0) {
                Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                               *(HeapEntity **)(*(long *)(p_Var9 + 3) + 0x40));
              }
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            } while (p_Var9 != local_a0);
          }
          p_Var9 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var9 != local_b0) {
            do {
              Heap::markFrom((Heap *)(ulong)*(uint *)&(this->heap).lastMark,
                             *(HeapEntity **)(p_Var9 + 2));
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            } while (p_Var9 != local_b0);
          }
          Heap::sweep(&this->heap);
        }
        encode_utf8(&local_98,(internal *)local_f8.file._M_dataplus._M_p,
                    (UString *)local_f8.file._M_string_length);
        ppHVar13 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                   ::operator[](local_58,&local_98);
        pFVar17 = local_60;
        *ppHVar13 = from;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.file._M_dataplus._M_p != &local_f8.file.field_2) {
          operator_delete(local_f8.file._M_dataplus._M_p,
                          CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                                   local_f8.file.field_2._M_local_buf[0]) * 4 + 4);
        }
      }
      pFVar16 = pFVar16 + 1;
    } while (pFVar16 != pFVar17);
  }
  return;
}

Assistant:

Interpreter(Allocator *alloc, const ExtMap &ext_vars, unsigned max_stack, double gc_min_objects,
                double gc_growth_trigger, const VmNativeCallbackMap &native_callbacks,
                JsonnetImportCallback *import_callback, void *import_callback_context)

        : heap(gc_min_objects, gc_growth_trigger),
          stack(max_stack),
          alloc(alloc),
          idImport(alloc->makeIdentifier(U"import")),
          idArrayElement(alloc->makeIdentifier(U"array_element")),
          idInvariant(alloc->makeIdentifier(U"object_assert")),
          idInternal(alloc->makeIdentifier(U"__internal__")),
          idJsonObjVar(alloc->makeIdentifier(U"_")),
          idEmpty(alloc->makeIdentifier(U"")),
          jsonObjVar(alloc->make<Var>(LocationRange(), Fodder{}, idJsonObjVar)),
          externalVars(ext_vars),
          nativeCallbacks(native_callbacks),
          importCallback(import_callback),
          importCallbackContext(import_callback_context)
    {
        scratch = makeNull();
        builtins["makeArray"] = &Interpreter::builtinMakeArray;
        builtins["pow"] = &Interpreter::builtinPow;
        builtins["floor"] = &Interpreter::builtinFloor;
        builtins["ceil"] = &Interpreter::builtinCeil;
        builtins["sqrt"] = &Interpreter::builtinSqrt;
        builtins["sin"] = &Interpreter::builtinSin;
        builtins["cos"] = &Interpreter::builtinCos;
        builtins["tan"] = &Interpreter::builtinTan;
        builtins["asin"] = &Interpreter::builtinAsin;
        builtins["acos"] = &Interpreter::builtinAcos;
        builtins["atan"] = &Interpreter::builtinAtan;
        builtins["type"] = &Interpreter::builtinType;
        builtins["filter"] = &Interpreter::builtinFilter;
        builtins["objectHasEx"] = &Interpreter::builtinObjectHasEx;
        builtins["length"] = &Interpreter::builtinLength;
        builtins["objectFieldsEx"] = &Interpreter::builtinObjectFieldsEx;
        builtins["codepoint"] = &Interpreter::builtinCodepoint;
        builtins["char"] = &Interpreter::builtinChar;
        builtins["log"] = &Interpreter::builtinLog;
        builtins["exp"] = &Interpreter::builtinExp;
        builtins["mantissa"] = &Interpreter::builtinMantissa;
        builtins["exponent"] = &Interpreter::builtinExponent;
        builtins["modulo"] = &Interpreter::builtinModulo;
        builtins["extVar"] = &Interpreter::builtinExtVar;
        builtins["primitiveEquals"] = &Interpreter::builtinPrimitiveEquals;
        builtins["native"] = &Interpreter::builtinNative;
        builtins["md5"] = &Interpreter::builtinMd5;
        builtins["trace"] = &Interpreter::builtinTrace;
        builtins["splitLimit"] = &Interpreter::builtinSplitLimit;
        builtins["substr"] = &Interpreter::builtinSubstr;
        builtins["range"] = &Interpreter::builtinRange;
        builtins["strReplace"] = &Interpreter::builtinStrReplace;
        builtins["asciiLower"] = &Interpreter::builtinAsciiLower;
        builtins["asciiUpper"] = &Interpreter::builtinAsciiUpper;
        builtins["join"] = &Interpreter::builtinJoin;
        builtins["parseJson"] = &Interpreter::builtinParseJson;
        builtins["parseYaml"] = &Interpreter::builtinParseYaml;
        builtins["encodeUTF8"] = &Interpreter::builtinEncodeUTF8;
        builtins["decodeUTF8"] = &Interpreter::builtinDecodeUTF8;
        builtins["atan2"] = &Interpreter::builtinAtan2;
        builtins["hypot"] = &Interpreter::builtinHypot;

        DesugaredObject *stdlib = makeStdlibAST(alloc, "__internal__");
        jsonnet_static_analysis(stdlib);
        stdlibAST = stdlib; // stdlibAST is const, so we need to do analysis before this assignment
        auto stdThunk = makeHeap<HeapThunk>(nullptr, nullptr, 0, static_cast<const AST*>(stdlibAST));
        stack.newCall(stdThunk->body->location, stdThunk, stdThunk->self, stdThunk->offset, stdThunk->upValues);
        evaluate(stdThunk->body, 0);
        stdObject = dynamic_cast<HeapObject*>(scratch.v.h);
        prepareSourceValThunks();
    }